

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::NavigationArrow::minimumSizeHint(NavigationArrow *this)

{
  int iVar1;
  int iVar2;
  NavigationArrowPrivate *pNVar3;
  int height;
  int width;
  NavigationArrow *this_local;
  
  iVar1 = FingerGeometry::width();
  iVar1 = qRound((double)iVar1 / 5.0);
  iVar2 = FingerGeometry::height();
  iVar2 = qRound((double)iVar2 / 3.0);
  pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
           ::operator->(&this->d);
  if ((pNVar3->direction != Left) &&
     (pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
               ::operator->(&this->d), pNVar3->direction != Right)) {
    QSize::QSize((QSize *)&this_local,iVar2,iVar1);
    return (QSize)this_local;
  }
  QSize::QSize((QSize *)&this_local,iVar1,iVar2);
  return (QSize)this_local;
}

Assistant:

QSize
NavigationArrow::minimumSizeHint() const
{
	const int width = qRound( (qreal) FingerGeometry::width() / 5.0 );
	const int height = qRound( (qreal) FingerGeometry::height() / 3.0 );

	return ( ( d->direction == Left || d->direction == Right ) ?
		QSize( width, height ) : QSize( height, width ) );
}